

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

UA_StatusCode socket_write(UA_Connection *connection,UA_ByteString *buf)

{
  ssize_t sVar1;
  int *piVar2;
  UA_StatusCode UVar3;
  ulong uVar4;
  
  uVar4 = 0;
  do {
    while( true ) {
      sVar1 = send(connection->sockfd,buf->data + uVar4,buf->length - uVar4,0);
      if (sVar1 < 0) break;
      uVar4 = uVar4 + sVar1;
      if (buf->length <= uVar4) {
        UVar3 = 0;
LAB_00125956:
        UA_ByteString_deleteMembers(buf);
        return UVar3;
      }
    }
    piVar2 = __errno_location();
  } while ((*piVar2 == 4) || (*piVar2 == 0xb));
  (*connection->close)(connection);
  socket_close(connection);
  UVar3 = 0x80ae0000;
  goto LAB_00125956;
}

Assistant:

static UA_StatusCode
socket_write(UA_Connection *connection, UA_ByteString *buf) {
    size_t nWritten = 0;
    do {
        ssize_t n = 0;
        do {
        /* If the OS throws EMSGSIZE, force a smaller packet size:
         * size_t bytes_to_send = buf->length - nWritten >  1024 ? 1024 : buf->length - nWritten; */
            size_t bytes_to_send = buf->length - nWritten;
            n = send((SOCKET)connection->sockfd, (const char*)buf->data + nWritten,
                     WIN32_INT bytes_to_send, 0);
            if(n < 0 && errno__ != INTERRUPTED && errno__ != AGAIN) {
                connection->close(connection);
                socket_close(connection);
                UA_ByteString_deleteMembers(buf);
                return UA_STATUSCODE_BADCONNECTIONCLOSED;
            }
        } while(n < 0);
        nWritten += (size_t)n;
    } while(nWritten < buf->length);
    UA_ByteString_deleteMembers(buf);
    return UA_STATUSCODE_GOOD;
}